

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedSSOAtomicCounters::Run(AdvancedSSOAtomicCounters *this)

{
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  GLuint GVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int i;
  int h;
  ulong uVar9;
  vec4 *expected;
  long lVar10;
  allocator_type local_e9;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  vec4 zero;
  mat4 identity;
  
  bVar5 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,1);
  if (bVar5) {
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
    GVar6 = ShaderImageLoadStoreBase::BuildShaderProgram
                      (&this->super_ShaderImageLoadStoreBase,0x8b31,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(location = 1) in vec4 i_color;\nlayout(location = 3) out vec4 o_color;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nlayout(std140) uniform Transform {\n  mat4 mvp;\n} g_transform;\nwriteonly uniform imageBuffer g_buffer;\nlayout(binding = 0, offset = 0) uniform atomic_uint g_counter;\nvoid main() {\n  gl_Position = g_transform.mvp * i_position;\n  o_color = i_color;\n  const uint index = atomicCounterIncrement(g_counter);\n  imageStore(g_buffer, int(index), gl_Position);\n}"
                      );
    this->m_vsp = GVar6;
    GVar6 = ShaderImageLoadStoreBase::BuildShaderProgram
                      (&this->super_ShaderImageLoadStoreBase,0x8b30,
                       "#version 420 core\nlayout(location = 3) in vec4 i_color;\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = i_color;\n}"
                      );
    this->m_fsp = GVar6;
    this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    h = 1;
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,1,this->m_vsp);
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,2,this->m_fsp);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x40,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_buffer_tex);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,this->m_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->m_counter_buffer);
    tcu::Vector<float,_4>::Vector(&zero,0.0);
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,&zero,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,this->m_transform_buffer);
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x3f800000);
    tcu::Matrix<float,_4,_4>::Matrix(&identity,(float *)&data);
    glu::CallLogWrapper::glBufferData(this_00,0x8a11,0x40,&identity,0x88e4);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->m_counter_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,0,this->m_transform_buffer);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_buffer_tex,0,'\0',0,0x88ba,0x8814);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
    glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_pipeline);
    expected = (vec4 *)0x0;
    glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(this_00,5,0,4,1,0);
    iVar7 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar7 = *(int *)CONCAT44(extraout_var,iVar7);
    iVar8 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    bVar5 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&this->super_ShaderImageLoadStoreBase,iVar7,
                       *(int *)(CONCAT44(extraout_var_00,iVar8) + 4),(int)&data,h,expected);
    if (bVar5) {
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&data,4,&local_e9);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
      glu::CallLogWrapper::glGetBufferSubData
                (this_00,0x8c2a,0,0x40,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar10 = 0;
      for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
        tcu::Vector<float,_4>::Vector
                  (&local_98,
                   (Vector<float,_4> *)
                   ((long)(data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10));
        auVar1._4_4_ = -(uint)(local_98.m_data[1] != -1.0);
        auVar1._0_4_ = -(uint)(local_98.m_data[0] != -1.0);
        auVar1._8_4_ = -(uint)(local_98.m_data[2] != 0.0);
        auVar1._12_4_ = -(uint)(local_98.m_data[3] != 1.0);
        iVar7 = movmskps(extraout_EAX,auVar1);
        if (iVar7 != 0) {
          tcu::Vector<float,_4>::Vector
                    (&local_a8,
                     (Vector<float,_4> *)
                     ((long)(data.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10));
          auVar2._4_4_ = -(uint)(local_a8.m_data[1] != -1.0);
          auVar2._0_4_ = -(uint)(local_a8.m_data[0] != 1.0);
          auVar2._8_4_ = -(uint)(local_a8.m_data[2] != 0.0);
          auVar2._12_4_ = -(uint)(local_a8.m_data[3] != 1.0);
          iVar7 = movmskps(extraout_EAX_00,auVar2);
          if (iVar7 != 0) {
            tcu::Vector<float,_4>::Vector
                      (&local_b8,
                       (Vector<float,_4> *)
                       ((long)(data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10));
            auVar3._4_4_ = -(uint)(local_b8.m_data[1] != 1.0);
            auVar3._0_4_ = -(uint)(local_b8.m_data[0] != -1.0);
            auVar3._8_4_ = -(uint)(local_b8.m_data[2] != 0.0);
            auVar3._12_4_ = -(uint)(local_b8.m_data[3] != 1.0);
            iVar7 = movmskps(extraout_EAX_01,auVar3);
            if (iVar7 != 0) {
              tcu::Vector<float,_4>::Vector
                        (&local_c8,
                         (Vector<float,_4> *)
                         ((long)(data.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10));
              auVar4._4_4_ = -(uint)(local_c8.m_data[1] != 1.0);
              auVar4._0_4_ = -(uint)(local_c8.m_data[0] != 1.0);
              auVar4._8_4_ = -(uint)(local_c8.m_data[2] != 0.0);
              auVar4._12_4_ = -(uint)(local_c8.m_data[3] != 1.0);
              iVar7 = movmskps(extraout_EAX_02,auVar4);
              if (iVar7 != 0) break;
            }
          }
        }
        lVar10 = lVar10 + 0x10;
      }
      lVar10 = -(ulong)(uVar9 < 4);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
    }
    else {
      lVar10 = -1;
    }
  }
  else {
    lVar10 = 0x10;
  }
  return lVar10;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);
		const char* const glsl_vs =
			"#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
			"layout(location = 1) in vec4 i_color;" NL "layout(location = 3) out vec4 o_color;" NL
			"out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "layout(std140) uniform Transform {" NL
			"  mat4 mvp;" NL "} g_transform;" NL "writeonly uniform imageBuffer g_buffer;" NL
			"layout(binding = 0, offset = 0) uniform atomic_uint g_counter;" NL "void main() {" NL
			"  gl_Position = g_transform.mvp * i_position;" NL "  o_color = i_color;" NL
			"  const uint index = atomicCounterIncrement(g_counter);" NL
			"  imageStore(g_buffer, int(index), gl_Position);" NL "}";
		const char* const glsl_fs =
			"#version 420 core" NL "layout(location = 3) in vec4 i_color;" NL
			"layout(location = 0) out vec4 o_color;" NL "void main() {" NL "  o_color = i_color;" NL "}";
		m_vsp = BuildShaderProgram(GL_VERTEX_SHADER, glsl_vs);
		m_fsp = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs);

		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);

		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glBufferData(GL_TEXTURE_BUFFER, sizeof(vec4) * 4, NULL, GL_STATIC_DRAW);

		glBindTexture(GL_TEXTURE_BUFFER, m_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_buffer);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counter_buffer);
		vec4 zero(0);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), &zero, GL_STATIC_DRAW);

		glBindBuffer(GL_UNIFORM_BUFFER, m_transform_buffer);
		mat4 identity(1);
		glBufferData(GL_UNIFORM_BUFFER, sizeof(mat4), &identity, GL_STATIC_DRAW);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer);
		glBindBufferBase(GL_UNIFORM_BUFFER, 0, m_transform_buffer);
		glBindImageTexture(0, m_buffer_tex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindVertexArray(m_vao);
		glBindProgramPipeline(m_pipeline);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLE_STRIP, 0, 4, 1, 0);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}

		std::vector<vec4> data(4);
		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glGetBufferSubData(GL_TEXTURE_BUFFER, 0, sizeof(vec4) * 4, &data[0]);

		for (int i = 0; i < 4; ++i)
		{
			if (!IsEqual(data[i], vec4(-1.0f, -1.0f, 0.0f, 1.0f)) && !IsEqual(data[i], vec4(1.0f, -1.0f, 0.0f, 1.0f)) &&
				!IsEqual(data[i], vec4(-1.0f, 1.0f, 0.0f, 1.0f)) && !IsEqual(data[i], vec4(1.0f, 1.0f, 0.0f, 1.0f)))
			{
				return ERROR;
			}
		}

		return NO_ERROR;
	}